

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,string *key,string *parent_key_information)

{
  string *str;
  bool bVar1;
  ulong uVar2;
  CfdException *this_00;
  size_type sVar3;
  reference pvVar4;
  string local_368;
  Privkey local_348;
  string errmsg_1;
  CfdException *except_1;
  undefined1 local_2d8 [8];
  Privkey privkey;
  string errmsg;
  CfdException *except;
  undefined1 local_268 [8];
  SchnorrPubkey schnorr;
  Pubkey local_238;
  undefined1 local_220 [8];
  ByteData bytes;
  undefined1 local_200 [7];
  bool is_wif;
  ExtPrivkey local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong local_c0;
  size_t index;
  string local_b0 [32];
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string hdkey_top;
  string local_50;
  string *local_20;
  string *parent_key_information_local;
  string *key_local;
  DescriptorKeyInfo *this_local;
  
  local_20 = parent_key_information;
  parent_key_information_local = key;
  key_local = (string *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::__cxx11::string::string((string *)&this->parent_info_);
  ::std::__cxx11::string::string((string *)&this->path_);
  ::std::__cxx11::string::string((string *)&this->key_string_);
  uVar2 = ::std::__cxx11::string::size();
  if (3 < uVar2) {
    ::std::__cxx11::string::substr
              ((ulong)&list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (ulong)parent_key_information_local);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &list.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"pub");
    if ((bVar1) ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&list.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"prv"),
       bVar1)) {
      str = parent_key_information_local;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b0,"/",(allocator *)((long)&index + 7));
      StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_90,(string *)str,(string *)local_b0);
      ::std::__cxx11::string::~string(local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
      for (local_c0 = 1; uVar2 = local_c0,
          sVar3 = ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_90), uVar2 < sVar3; local_c0 = local_c0 + 1) {
        pvVar4 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_90,local_c0);
        ::std::operator+(&local_e0,"/",pvVar4);
        ::std::__cxx11::string::operator+=((string *)&this->path_,(string *)&local_e0);
        ::std::__cxx11::string::~string((string *)&local_e0);
      }
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&list.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"prv");
      if (bVar1) {
        this->key_type_ = kDescriptorKeyBip32Priv;
        pvVar4 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_90,0);
        ExtPrivkey::ExtPrivkey(&local_170,pvVar4);
        ExtPrivkey::operator=(&this->extprivkey_,&local_170);
        ExtPrivkey::~ExtPrivkey(&local_170);
      }
      else {
        this->key_type_ = kDescriptorKeyBip32;
        pvVar4 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_90,0);
        ExtPubkey::ExtPubkey((ExtPubkey *)local_200,pvVar4);
        ExtPubkey::operator=(&this->extpubkey_,(ExtPubkey *)local_200);
        ExtPubkey::~ExtPubkey((ExtPubkey *)local_200);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_90);
    }
    else {
      this->key_type_ = kDescriptorKeyPublic;
      bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      ByteData::ByteData((ByteData *)local_220,parent_key_information_local);
      bVar1 = Pubkey::IsValid((ByteData *)local_220);
      if (bVar1) {
        ByteData::ByteData((ByteData *)
                           &schnorr.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_220)
        ;
        Pubkey::Pubkey(&local_238,
                       (ByteData *)
                       &schnorr.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
        Pubkey::operator=(&this->pubkey_,&local_238);
        Pubkey::~Pubkey(&local_238);
        ByteData::~ByteData((ByteData *)
                            &schnorr.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_268,(ByteData *)local_220);
        SchnorrPubkey::operator=(&this->schnorr_pubkey_,(SchnorrPubkey *)local_268);
        SchnorrPubkey::GetHex_abi_cxx11_((string *)&except,&this->schnorr_pubkey_);
        ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&except);
        ::std::__cxx11::string::~string((string *)&except);
        this->key_type_ = kDescriptorKeySchnorr;
        SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_268);
      }
      ByteData::~ByteData((ByteData *)local_220);
      if ((bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        Privkey::Privkey((Privkey *)local_2d8);
        Privkey::FromWif((Privkey *)&except_1,parent_key_information_local,kMainnet,true);
        Privkey::operator=(&this->privkey_,(Privkey *)&except_1);
        Privkey::~Privkey((Privkey *)&except_1);
        bVar1 = Privkey::IsValid(&this->privkey_);
        if (!bVar1) {
          Privkey::FromWif(&local_348,parent_key_information_local,kTestnet,true);
          Privkey::operator=(&this->privkey_,&local_348);
          Privkey::~Privkey(&local_348);
        }
        Privkey::GetWif_abi_cxx11_(&local_368,&this->privkey_);
        ::std::__cxx11::string::operator=((string *)&this->key_string_,(string *)&local_368);
        ::std::__cxx11::string::~string((string *)&local_368);
        Privkey::~Privkey((Privkey *)local_2d8);
      }
    }
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ::std::__cxx11::string::operator=
                ((string *)&this->parent_info_,(string *)parent_key_information);
    }
    ::std::__cxx11::string::~string
              ((string *)
               &list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  hdkey_top.field_2._M_local_buf[0xe] = '\x01';
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_50,"DescriptorKeyInfo illegal key.",
             (allocator *)(hdkey_top.field_2._M_local_buf + 0xf));
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
  hdkey_top.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const std::string& key, const std::string parent_key_information) {
  if (key.size() < 4) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "DescriptorKeyInfo illegal key.");
  }
  // analyze format
  std::string hdkey_top = key.substr(1, 3);
  if ((hdkey_top == "pub") || (hdkey_top == "prv")) {
    std::vector<std::string> list = StringUtil::Split(key, "/");
    for (size_t index = 1; index < list.size(); ++index) {
      path_ += "/" + list[index];
    }
    if (hdkey_top == "prv") {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32Priv;
      extprivkey_ = ExtPrivkey(list[0]);
    } else {
      key_type_ = DescriptorKeyType::kDescriptorKeyBip32;
      extpubkey_ = ExtPubkey(list[0]);
    }
  } else {
    key_type_ = DescriptorKeyType::kDescriptorKeyPublic;
    bool is_wif = false;
    try {
      // pubkey format check
      ByteData bytes(key);
      if (Pubkey::IsValid(bytes)) {
        // pubkey
        pubkey_ = Pubkey(bytes);
      } else {
        // schnorr pubkey
        SchnorrPubkey schnorr(bytes);
        schnorr_pubkey_ = schnorr;
        key_string_ = schnorr_pubkey_.GetHex();
        key_type_ = DescriptorKeyType::kDescriptorKeySchnorr;
      }
    } catch (const CfdException& except) {
      std::string errmsg(except.what());
      if (Privkey::HasWif(key)) {
        is_wif = true;
      } else {
        throw except;
      }
    }
    if (is_wif) {
      Privkey privkey;
      // privkey WIF check
      try {
        privkey_ = Privkey::FromWif(key, NetType::kMainnet);
      } catch (const CfdException& except) {
        std::string errmsg(except.what());
        if (errmsg.find("Error WIF to Private key.") == std::string::npos) {
          throw except;
        }
      }
      if (!privkey_.IsValid()) {
        privkey_ = Privkey::FromWif(key, NetType::kTestnet);
      }
      key_string_ = privkey_.GetWif();
    }
  }

  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
}